

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomBuilderCmd.cpp
# Opt level: O3

char * get_multiple_arg_token_next(char *arg)

{
  char *__s;
  size_t sVar1;
  
  if (arg != (char *)0x0) {
    for (__s = strchr(arg,0x2c); __s != (char *)0x0; __s = strchr(__s + 1,0x2c)) {
      if (__s[-1] != '\\') {
        sVar1 = strlen(__s);
        if (sVar1 == 1) {
          return (char *)0x0;
        }
        return __s + 1;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

static const char *
get_multiple_arg_token_next(const char *arg)
{
  const char *tok;

  if (!arg)
    return 0;

  tok = strchr (arg, ',');

  /* make sure it is not escaped */
  while (tok)
    {
      if (*(tok-1) == '\\')
        {
          /* find the next one */
          tok = strchr (tok+1, ',');
        }
      else
        break;
    }

  if (! tok || strlen(tok) == 1)
    return 0;

  return tok+1;
}